

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

bool __thiscall HModel::nonbasicFlagBasicIndex_OK(HModel *this,int XnumCol,int XnumRow)

{
  reference pvVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int row;
  int var;
  int numBasic;
  int XnumTot;
  int local_28;
  int local_24;
  int local_20;
  bool local_1;
  
  local_20 = 0;
  if (0 < in_ESI + in_EDX) {
    for (local_24 = 0; local_24 < in_ESI + in_EDX; local_24 = local_24 + 1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)local_24);
      if (*pvVar1 == 0) {
        local_20 = local_20 + 1;
      }
    }
  }
  if (local_20 == in_EDX) {
    if (0 < in_EDX) {
      for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
        pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),(long)local_28);
        pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)*pvVar1);
        if (*pvVar1 != 0) {
          return false;
        }
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HModel::nonbasicFlagBasicIndex_OK(int XnumCol, int XnumRow) {
  assert(XnumCol >= 0);
  assert(XnumRow >= 0);
  //  printf("Called nonbasicFlagBasicIndex_OK(%d, %d)\n", XnumCol, XnumRow);cout << flush;
  int XnumTot = XnumCol + XnumRow;
  int numBasic = 0;
  if (XnumTot > 0) {
    for (int var=0; var < XnumTot; var++) if (!nonbasicFlag[var]) numBasic++;
  }
  assert(numBasic == XnumRow);
  if (numBasic != XnumRow) return false;
  if (XnumRow > 0) {
    for (int row=0; row < XnumRow; row++) {
      assert(!nonbasicFlag[basicIndex[row]]);
      if (nonbasicFlag[basicIndex[row]]) return false;
    }
  }
  return true;
}